

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::ColorPicker4(char *label,float *col,ImGuiColorEditFlags flags,float *ref_col)

{
  float *out_g;
  ImVec2 *out_b;
  long lVar1;
  ImGuiWindow *pIVar2;
  ImDrawIdx *pIVar3;
  ImDrawVert *pIVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined1 __src [8];
  ImDrawList *pIVar11;
  undefined4 col_00;
  uint uVar12;
  ImU32 IVar13;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  char *text_end;
  byte bVar14;
  char cVar15;
  int iVar16;
  ImU32 col_bot_right;
  ImGuiContext *pIVar17;
  uint uVar18;
  ImGuiContext *g;
  undefined7 uVar20;
  ulong uVar19;
  ImVec2 *pIVar21;
  long lVar22;
  bool bVar23;
  uint uVar24;
  int iVar25;
  float fVar26;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  ImVec2 p_min;
  ImVec2 pos;
  undefined4 extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  ImVec2 IVar27;
  ImVec2 pos_00;
  undefined4 extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  int iVar30;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  int iVar31;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined8 extraout_XMM0_Qb;
  ImVec2 p_max;
  ImVec2 p_max_00;
  ImVec2 half_sz;
  ImVec2 gradient_p1;
  ImVec2 half_sz_00;
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  undefined1 auVar42 [16];
  float fVar43;
  float V;
  float B;
  float G;
  float R;
  ImVec2 triangle_pc;
  ImVec2 triangle_pa;
  float vv;
  ImVec2 current_off_unrotated;
  ImVec2 picker_pos;
  ImVec2 tra;
  float ww;
  float uu;
  float backup_initial_col [4];
  ImVec2 trc;
  ImVec2 trb;
  float local_260;
  float local_25c;
  float local_258;
  uint local_254;
  float local_250;
  float local_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  ImGuiContext *local_220;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  ImVec2 *local_200;
  float local_1f4;
  float local_1f0;
  float local_1ec;
  undefined1 local_1e8 [8];
  undefined8 uStack_1e0;
  ImVec2 local_1d8;
  uint local_1cc;
  ImVec2 local_1c8;
  ImVec2 local_1c0;
  float local_1b8;
  float fStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  ImVec2 local_1a0;
  undefined1 local_198 [8];
  ImVec2 local_190;
  float local_188;
  float fStack_184;
  uint uStack_180;
  uint uStack_17c;
  ImVec2 local_178;
  float fStack_170;
  float fStack_16c;
  int local_168;
  int local_164;
  uint local_160;
  ImDrawList *local_150;
  ImVec2 local_148;
  ImU32 local_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  ImVec2 local_118;
  ImVec2 local_110;
  ImGuiWindow *local_108;
  ImU32 local_100;
  uint local_fc;
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  ImVec4 local_e8;
  undefined1 local_d8 [16];
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  size_t local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  uint uStack_70;
  uint uStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [24];
  ImVec2 local_40;
  ImVec2 local_38;
  undefined1 auVar33 [16];
  
  pIVar17 = GImGui;
  uStack_1e0 = local_1e8;
  local_1e8 = (undefined1  [8])ref_col;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->SkipItems != false) {
    bVar14 = 0;
    goto LAB_002ea31c;
  }
  local_150 = pIVar2->DrawList;
  local_248._0_4_ = CalcItemWidth();
  local_248._4_4_ = extraout_XMM0_Db;
  fStack_240 = (float)extraout_XMM0_Dc;
  fStack_23c = (float)extraout_XMM0_Dd;
  local_220 = pIVar17;
  (pIVar17->NextItemData).Flags = 0;
  PushID(label);
  BeginGroup();
  uVar18 = (uint)~flags >> 4 & 0x10 | flags;
  if ((flags & 8U) == 0) {
    ColorPickerOptionsPopup(col,uVar18);
  }
  pIVar17 = local_220;
  if ((flags & 0x6000000U) == 0) {
    uVar12 = local_220->ColorEditOptions & 0x6000000;
    uVar24 = 0x2000000;
    if (uVar12 != 0) {
      uVar24 = uVar12;
    }
    uVar18 = uVar18 | uVar24;
  }
  if ((uVar18 & 0x18000000) == 0) {
    uVar12 = local_220->ColorEditOptions & 0x18000000;
    uVar24 = 0x8000000;
    if (uVar12 != 0) {
      uVar24 = uVar12;
    }
    uVar18 = uVar18 | uVar24;
  }
  uVar24 = (uVar18 & 0x6000000) - 1;
  if ((uVar18 & 0x6000000 ^ uVar24) <= uVar24) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_widgets.cpp"
                  ,0x1177,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  uVar24 = (uVar18 & 0x18000000) - 1;
  if ((uVar18 & 0x18000000 ^ uVar24) <= uVar24) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_widgets.cpp"
                  ,0x1178,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  if ((uVar18 & 8) == 0) {
    uVar18 = uVar18 | local_220->ColorEditOptions & 0x10000U;
  }
  local_1cc = uVar18 & 0x10002;
  bVar23 = local_1cc == 0x10000;
  IVar27 = (pIVar2->DC).CursorPos;
  local_200 = (ImVec2 *)col;
  local_148 = IVar27;
  local_108 = pIVar2;
  local_188 = GetFrameHeight();
  pIVar21 = local_200;
  fVar38 = (pIVar17->Style).ItemInnerSpacing.x;
  local_128 = ZEXT416((uint)fVar38);
  fVar38 = (float)local_248._0_4_ - (local_188 + fVar38) * (float)(byte)(bVar23 + 1);
  uVar24 = -(uint)(fVar38 <= local_188);
  fStack_1b4 = (float)(local_248._4_4_ & (uint)extraout_XMM0_Db_00);
  uStack_1b0 = (uint)fStack_240 & extraout_XMM0_Dc_00;
  uStack_1ac = (uint)fStack_23c & extraout_XMM0_Dd_00;
  local_1b8 = (float)(uVar24 & (uint)local_188 | ~uVar24 & (uint)fVar38);
  local_b0 = (ulong)((uVar18 & 2) == 0) * 4 + 0xc;
  fStack_184 = extraout_XMM0_Db_00;
  uStack_180 = extraout_XMM0_Dc_00;
  uStack_17c = extraout_XMM0_Dd_00;
  memcpy(local_58,local_200,local_b0);
  local_24c = local_1b8 * 0.08;
  local_98 = ZEXT416((uint)(local_1b8 * 0.5));
  local_1c0.x = local_1b8 * 0.5 - local_24c;
  _local_c8 = ZEXT416((uint)local_1c0.x);
  local_250 = IVar27.x;
  local_78 = local_1b8 + local_250;
  fStack_74 = fStack_1b4;
  uStack_70 = uStack_1b0;
  uStack_6c = uStack_1ac;
  _fStack_210 = 0;
  local_218._0_4_ = IVar27.x;
  local_218._4_4_ = IVar27.y;
  local_f8._0_4_ = (local_188 + local_1b8) * 0.5 + local_250;
  local_f8._4_4_ = local_1b8 * 0.5 + IVar27.y;
  fStack_f0 = fStack_184 * 0.0 + 0.0;
  fStack_ec = fStack_1b4 * 0.0 + 0.0;
  local_1d8.y = (float)local_f8._4_4_;
  local_1d8.x = (float)local_f8._0_4_;
  local_1c0.x = local_1c0.x - (float)(int)(local_1b8 * 0.027);
  local_1a0.x = local_1c0.x * -0.5;
  local_1a0.y = local_1c0.x * -0.866025;
  local_1c0.y = 0.0;
  local_1c8.y = local_1c0.x * 0.866025;
  local_260 = pIVar21->x;
  local_25c = pIVar21->y;
  local_258 = pIVar21[1].x;
  local_248._4_4_ = local_128._4_4_;
  local_248._0_4_ = (float)local_128._0_4_ + local_78;
  fStack_240 = (float)local_128._8_4_;
  fStack_23c = (float)local_128._12_4_;
  local_1f4 = local_258;
  local_1f0 = local_25c;
  local_1ec = local_260;
  local_1c8.x = local_1a0.x;
  if ((uVar18 >> 0x1b & 1) == 0) {
    fVar38 = (float)local_128._0_4_ + local_78;
    if ((uVar18 >> 0x1c & 1) != 0) {
      ColorConvertHSVtoRGB(local_260,local_25c,local_258,&local_1ec,&local_1f0,&local_1f4);
      goto LAB_002e8b40;
    }
  }
  else {
    ColorConvertRGBtoHSV(local_260,local_25c,local_258,&local_260,&local_25c,&local_258);
LAB_002e8b40:
    fVar38 = (float)local_248._0_4_;
  }
  local_238._4_4_ = fStack_184;
  local_238._0_4_ = local_188 + fVar38;
  fStack_230 = (float)uStack_180;
  fStack_22c = (float)uStack_17c;
  PushItemFlag(8,true);
  uVar20 = (undefined7)((ulong)pIVar17 >> 8);
  if ((uVar18 >> 0x1a & 1) == 0) {
    if ((uVar18 >> 0x19 & 1) == 0) {
      auVar5._12_4_ = 0;
      auVar5._0_12_ = local_138._4_12_;
      local_138 = auVar5 << 0x20;
      local_254 = 0;
      uVar19 = 0;
    }
    else {
      local_178.y = local_1b8;
      local_178.x = local_1b8;
      InvisibleButton("sv",&local_178);
      bVar23 = IsItemActive();
      if (bVar23) {
        auVar32._0_4_ = local_1b8 + -1.0;
        IVar27 = (pIVar17->IO).MousePos;
        auVar28._0_4_ = IVar27.x - (float)local_218._0_4_;
        auVar28._4_4_ = IVar27.y - (float)local_218._4_4_;
        auVar28._8_4_ = 0.0 - fStack_210;
        auVar28._12_4_ = 0.0 - fStack_20c;
        auVar32._4_4_ = auVar32._0_4_;
        auVar32._8_4_ = auVar32._0_4_;
        auVar32._12_4_ = auVar32._0_4_;
        auVar29 = divps(auVar28,auVar32);
        fVar38 = auVar29._4_4_;
        iVar16 = -(uint)(1.0 < auVar29._0_4_);
        iVar25 = -(uint)(1.0 < fVar38);
        auVar34._4_4_ = iVar25;
        auVar34._0_4_ = iVar16;
        auVar34._8_4_ = iVar25;
        auVar34._12_4_ = iVar25;
        auVar33._8_8_ = auVar34._8_8_;
        auVar33._4_4_ = iVar16;
        auVar33._0_4_ = iVar16;
        uVar24 = movmskpd((int)CONCAT71(extraout_var,bVar23),auVar33);
        auVar42 = ZEXT816(0x3f800000);
        if ((uVar24 & 1) == 0) {
          auVar42 = auVar29;
        }
        local_25c = (float)(~-(uint)(auVar29._0_4_ < 0.0) & auVar42._0_4_);
        fVar26 = 0.0;
        if ((uVar24 & 2) == 0) {
          fVar26 = 1.0 - fVar38;
        }
        local_258 = (float)(-(uint)(fVar38 < 0.0) & 0x3f800000 |
                           ~-(uint)(fVar38 < 0.0) & (uint)fVar26);
        local_138._0_4_ = (int)CONCAT71((uint7)(uint3)(uVar24 >> 8),1);
      }
      else {
        auVar6._12_4_ = 0;
        auVar6._0_12_ = local_138._4_12_;
        local_138 = auVar6 << 0x20;
      }
      if ((uVar18 & 8) == 0) {
        OpenPopupOnItemClick("context",1);
      }
      local_178.y = (float)local_218._4_4_;
      local_178.x = (float)local_248._0_4_;
      SetCursorScreenPos(&local_178);
      local_178.y = local_1b8;
      local_178.x = local_188;
      InvisibleButton("hue",&local_178);
      bVar23 = IsItemActive();
      if (bVar23) {
        fVar38 = ((pIVar17->IO).MousePos.y - (float)local_218._4_4_) / (local_1b8 + -1.0);
        local_260 = 1.0;
        if (fVar38 <= 1.0) {
          local_260 = fVar38;
        }
        local_260 = (float)(~-(uint)(fVar38 < 0.0) & (uint)local_260);
        local_254 = (uint)CONCAT71(extraout_var_00,1);
        uVar19 = CONCAT71(uVar20,1);
      }
      else {
        local_254 = 0;
        uVar19 = (ulong)(uint)local_138._0_4_;
      }
    }
  }
  else {
    local_178.y = local_1b8;
    local_178.x = (pIVar17->Style).ItemInnerSpacing.x + local_1b8 + local_188;
    InvisibleButton("hsv",&local_178);
    bVar23 = IsItemActive();
    if (bVar23) {
      fVar43 = (pIVar17->IO).MouseClickedPos[0].x - (float)local_f8._0_4_;
      fVar41 = (pIVar17->IO).MouseClickedPos[0].y - (float)local_f8._4_4_;
      fVar26 = (pIVar17->IO).MousePos.x - (float)local_f8._0_4_;
      local_a8 = ZEXT416((uint)fVar26);
      fVar38 = (pIVar17->IO).MousePos.y - (float)local_f8._4_4_;
      local_138 = ZEXT416((uint)fVar38);
      local_d8 = ZEXT416((uint)fVar41);
      local_88 = ZEXT416((uint)fVar43);
      fVar41 = fVar43 * fVar43 + fVar41 * fVar41;
      if ((fVar41 < ((float)local_c8._0_4_ + -1.0) * ((float)local_c8._0_4_ + -1.0)) ||
         (((float)local_98._0_4_ + 1.0) * ((float)local_98._0_4_ + 1.0) < fVar41)) {
        local_254 = 0;
      }
      else {
        fVar38 = atan2f(fVar38,fVar26);
        fVar38 = (fVar38 / 3.1415927) * 0.5;
        local_260 = (float)(~-(uint)(fVar38 < 0.0) & (uint)fVar38 |
                           (uint)(fVar38 + 1.0) & -(uint)(fVar38 < 0.0));
        local_254 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      local_f8._0_4_ = cosf(local_260 * -2.0 * 3.1415927);
      local_f8._4_4_ = extraout_XMM0_Db_01;
      fStack_f0 = (float)extraout_XMM0_Dc_01;
      fStack_ec = (float)extraout_XMM0_Dd_01;
      fVar38 = sinf(local_260 * -2.0 * 3.1415927);
      fVar26 = -(float)local_d8._0_4_;
      fVar41 = (float)local_f8._0_4_ * (float)local_d8._0_4_;
      local_d8._4_4_ = extraout_XMM0_Db_02;
      local_d8._0_4_ = fVar38;
      local_d8._8_4_ = extraout_XMM0_Dc_02;
      local_d8._12_4_ = extraout_XMM0_Dd_02;
      local_178.x = (float)local_f8._0_4_ * (float)local_88._0_4_ + fVar26 * fVar38;
      local_178.y = fVar38 * (float)local_88._0_4_ + fVar41;
      bVar23 = ImTriangleContainsPoint(&local_1c0,&local_1a0,&local_1c8,&local_178);
      if (bVar23) {
        local_178.x = (float)local_f8._0_4_ * (float)local_a8._0_4_ +
                      -(float)local_138._0_4_ * (float)local_d8._0_4_;
        local_178.y = (float)local_d8._0_4_ * (float)local_a8._0_4_ +
                      (float)local_f8._0_4_ * (float)local_138._0_4_;
        bVar23 = ImTriangleContainsPoint(&local_1c0,&local_1a0,&local_1c8,&local_178);
        if (!bVar23) {
          local_178 = ImTriangleClosestPoint(&local_1c0,&local_1a0,&local_1c8,&local_178);
        }
        ImTriangleBarycentricCoords
                  (&local_1c0,&local_1a0,&local_1c8,&local_178,&local_e8.x,(float *)local_198,
                   &local_110.x);
        fVar26 = 1.0 - (float)local_198._0_4_;
        fVar38 = 1.0;
        if (fVar26 <= 1.0) {
          fVar38 = fVar26;
        }
        local_258 = (float)(-(uint)(fVar26 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar26 < 0.0001) & (uint)fVar38);
        fVar26 = local_e8.x / local_258;
        fVar38 = 1.0;
        if (fVar26 <= 1.0) {
          fVar38 = fVar26;
        }
        local_25c = (float)(-(uint)(fVar26 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar26 < 0.0001) & (uint)fVar38);
        local_138._0_4_ = (int)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
        uVar19 = CONCAT71(uVar20,1);
        pIVar17 = local_220;
        pIVar21 = local_200;
      }
      else {
        auVar29._12_4_ = 0;
        auVar29._0_12_ = local_138._4_12_;
        local_138 = auVar29 << 0x20;
        uVar19 = (ulong)local_254;
      }
    }
    else {
      auVar42._12_4_ = 0;
      auVar42._0_12_ = local_138._4_12_;
      local_138 = auVar42 << 0x20;
      local_254 = 0;
      uVar19 = 0;
    }
    if ((uVar18 & 8) == 0) {
      OpenPopupOnItemClick("context",1);
    }
  }
  local_128._0_4_ = (float)local_128._0_4_ + (float)local_238._0_4_;
  if (local_1cc == 0x10000) {
    local_178.y = (float)local_218._4_4_;
    local_178.x = (float)local_128._0_4_;
    SetCursorScreenPos(&local_178);
    local_178.y = local_1b8;
    local_178.x = local_188;
    InvisibleButton("alpha",&local_178);
    bVar23 = IsItemActive();
    if (bVar23) {
      fVar26 = ((pIVar17->IO).MousePos.y - (float)local_218._4_4_) / (local_1b8 + -1.0);
      fVar38 = 1.0;
      if (fVar26 <= 1.0) {
        fVar38 = fVar26;
      }
      pIVar21[1].y = (float)(-(uint)(fVar26 < 0.0) & 0x3f800000 |
                            ~-(uint)(fVar26 < 0.0) & (uint)(1.0 - fVar38));
      uVar19 = CONCAT71((int7)(uVar19 >> 8),1);
    }
  }
  PopItemFlag();
  if ((uVar18 >> 8 & 1) == 0) {
    SameLine(0.0,(pIVar17->Style).ItemInnerSpacing.x);
    BeginGroup();
  }
  if ((-1 < (char)uVar18) && (text_end = FindRenderedTextEnd(label,(char *)0x0), text_end != label))
  {
    if ((uVar18 >> 8 & 1) != 0) {
      SameLine(0.0,(pIVar17->Style).ItemInnerSpacing.x);
    }
    TextEx(label,text_end,0);
  }
  if ((uVar18 >> 8 & 1) == 0) {
    PushItemFlag(0x10,true);
    local_178 = *pIVar21;
    fStack_170 = pIVar21[1].x;
    if ((uVar18 & 2) == 0) {
      fStack_16c = pIVar21[1].y;
    }
    else {
      fStack_16c = 1.0;
    }
    __src = local_1e8;
    if ((char)uVar18 < '\0') {
      Text("Current");
    }
    IVar27.x = local_188 * 3.0;
    IVar27.y = local_188 * 2.0;
    uStack_1e0._0_4_ = local_188 * 0.0;
    local_1e8._0_4_ = IVar27.x;
    local_1e8._4_4_ = IVar27.y;
    uStack_1e0._4_4_ = local_188 * 0.0;
    ColorButton("##current",(ImVec4 *)&local_178,uVar18 & 0x180e0040,IVar27);
    if (__src != (undefined1  [8])0x0) {
      Text("Original");
      local_e8._0_8_ = *(undefined8 *)__src;
      local_e8.z = *(float *)((long)__src + 8);
      if ((uVar18 & 2) == 0) {
        local_e8.w = *(float *)((long)__src + 0xc);
      }
      else {
        local_e8.w = 1.0;
      }
      bVar23 = ColorButton("##original",&local_e8,uVar18 & 0x180e0040,(ImVec2)local_1e8);
      if (bVar23) {
        memcpy(pIVar21,(void *)__src,local_b0);
        uVar19 = CONCAT71((int7)(uVar19 >> 8),1);
      }
    }
    PopItemFlag();
    EndGroup();
  }
  uVar24 = (uint)uVar19;
  fVar38 = local_188 * 0.2;
  fVar26 = 0.0;
  fVar41 = 0.0;
  fVar43 = 0.0;
  out_g = &pIVar21->y;
  out_b = pIVar21 + 1;
  if (((char)local_254 != '\0') || (local_138[0] != '\0')) {
    if ((uVar18 >> 0x1b & 1) == 0) {
      if ((uVar18 >> 0x1c & 1) != 0) {
        pIVar21->x = local_260;
        pIVar21->y = local_25c;
        pIVar21[1].x = local_258;
      }
    }
    else {
      _local_1e8 = ZEXT416((uint)fVar38);
      ColorConvertHSVtoRGB
                ((float)(~-(uint)(1.0 <= local_260) & (uint)local_260 |
                        (uint)(local_260 + -1e-05) & -(uint)(1.0 <= local_260)),
                 (float)(~-(uint)(0.0 < local_25c) & 0x3727c5ac |
                        (uint)local_25c & -(uint)(0.0 < local_25c)),
                 (float)(~-(uint)(0.0 < local_258) & 0x358637bd |
                        (uint)local_258 & -(uint)(0.0 < local_258)),&pIVar21->x,out_g,&out_b->x);
      fVar38 = (float)local_1e8._0_4_;
      fVar26 = (float)local_1e8._4_4_;
      fVar41 = (float)uStack_1e0;
      fVar43 = uStack_1e0._4_4_;
    }
  }
  iVar16 = (int)fVar38;
  iVar25 = (int)fVar26;
  iVar30 = (int)fVar41;
  iVar31 = (int)fVar43;
  if ((uVar18 & 0x20) == 0) {
    local_1e8._4_4_ = (int)fVar26;
    local_1e8._0_4_ = (int)fVar38;
    uStack_1e0._0_4_ = (float)(int)fVar41;
    uStack_1e0._4_4_ = (float)(int)fVar43;
    uVar19 = uVar19 & 0xffffffff;
    fVar38 = (float)local_128._0_4_;
    if (local_1cc != 0x10000) {
      fVar38 = (float)local_248._0_4_;
    }
    PushItemWidth((fVar38 + local_188) - local_250);
    uVar12 = uVar18 & 0x198e001a;
    cVar15 = '\x01';
    if (((uVar18 >> 0x14 & 1) != 0 || (uVar18 & 0x600000) == 0) &&
       (bVar23 = ColorEdit4("##rgb",&local_200->x,uVar12 | 0x100004), bVar23)) {
      uVar19 = CONCAT71((int7)(uVar19 >> 8),1);
      if (local_220->ActiveId == 0) {
        cVar15 = '\x01';
      }
      else {
        cVar15 = local_220->ActiveIdAllowOverlap;
      }
    }
    if ((uVar18 >> 0x15 & 1) != 0 || (uVar18 & 0x500000) == 0) {
      bVar23 = ColorEdit4("##hsv",&local_200->x,uVar12 | 0x200004);
      uVar19 = CONCAT71((int7)(uVar19 >> 8),(byte)uVar19 | bVar23);
    }
    uVar24 = (uint)uVar19;
    if ((uVar18 >> 0x16 & 1) != 0 || (uVar18 & 0x300000) == 0) {
      bVar23 = ColorEdit4("##hex",&local_200->x,uVar12 | 0x400004);
      uVar24 = (uint)CONCAT71((int7)(uVar19 >> 8),(byte)uVar19 | bVar23);
    }
    PopItemWidth();
    pIVar21 = local_200;
    pIVar17 = local_220;
    if ((uVar18 >> 0x1b & 1) != 0 && cVar15 == '\0') {
      ColorConvertRGBtoHSV
                (local_200->x,local_200->y,local_200[1].x,&local_178.x,&local_e8.x,
                 (float *)local_198);
      pIVar17 = local_220;
      if ((local_178.x <= 0.0) && (0.0 < local_260)) {
        if (0.0 < (float)local_198._0_4_) {
LAB_002e95db:
          if (0.0 < local_e8.x) goto LAB_002e9601;
          fVar38 = local_25c * 0.5;
        }
        else {
          if ((local_258 == (float)local_198._0_4_) &&
             (!NAN(local_258) && !NAN((float)local_198._0_4_))) goto LAB_002e95db;
          local_198._0_4_ = local_258 * 0.5;
          fVar38 = local_25c;
        }
        ColorConvertHSVtoRGB(local_260,fVar38,(float)local_198._0_4_,&pIVar21->x,out_g,&out_b->x);
      }
    }
LAB_002e9601:
    iVar16 = local_1e8._0_4_;
    iVar25 = local_1e8._4_4_;
    iVar30 = (int)(float)uStack_1e0;
    iVar31 = (int)uStack_1e0._4_4_;
  }
  local_68 = (float)iVar16;
  fStack_64 = (float)iVar25;
  fStack_60 = (float)iVar30;
  fStack_5c = (float)iVar31;
  if ((char)uVar24 != '\0') {
    if ((uVar18 >> 0x1b & 1) == 0) {
      if ((uVar18 >> 0x1c & 1) != 0) {
        local_260 = pIVar21->x;
        local_25c = pIVar21->y;
        local_258 = pIVar21[1].x;
        ColorConvertHSVtoRGB(local_260,local_25c,local_258,&local_1ec,&local_1f0,&local_1f4);
      }
    }
    else {
      local_1ec = pIVar21->x;
      local_1f0 = pIVar21->y;
      local_1f4 = pIVar21[1].x;
      ColorConvertRGBtoHSV(local_1ec,local_1f0,local_1f4,&local_260,&local_25c,&local_258);
    }
  }
  local_e8.w = (pIVar17->Style).Alpha;
  fVar38 = 1.0;
  if (local_e8.w <= 1.0) {
    fVar38 = local_e8.w;
  }
  iVar16 = (int)((float)(~-(uint)(local_e8.w < 0.0) & (uint)fVar38) * 255.0 + 0.5);
  local_e8.x = 1.0;
  local_e8.y = 1.0;
  local_e8.z = 1.0;
  col_bot_right = iVar16 * 0x1000000;
  local_168 = col_bot_right + 0xff0000;
  uVar12 = iVar16 << 0x18;
  local_160 = uVar12 | 0xff;
  fStack_170 = (float)(iVar16 << 0x18 | 0xff00);
  fStack_16c = (float)(iVar16 << 0x18 | 0xffff00);
  local_1e8 = (undefined1  [8])(CONCAT44(iVar16 << 0x18,uVar12) | 0xffff000000ff);
  uStack_1e0._0_4_ = fStack_170;
  uStack_1e0._4_4_ = fStack_16c;
  local_250 = (float)(col_bot_right + 0xffffff);
  local_178 = (ImVec2)(CONCAT44(iVar16 << 0x18,uVar12) | 0xffff000000ff);
  local_164 = col_bot_right + 0xff00ff;
  local_a8._0_4_ = col_bot_right + 0x808080;
  ColorConvertHSVtoRGB(local_260,1.0,1.0,&local_e8.x,&local_e8.y,&local_e8.z);
  IVar13 = ColorConvertFloat4ToU32(&local_e8);
  local_198._4_4_ = local_1f0;
  local_198._0_4_ = local_1ec;
  local_190.y = (pIVar17->Style).Alpha;
  local_190.x = local_1f4;
  local_13c = ColorConvertFloat4ToU32((ImVec4 *)local_198);
  pIVar11 = local_150;
  fVar38 = (float)local_1e8._0_4_;
  local_110.x = 0.0;
  local_110.y = 0.0;
  local_fc = uVar24;
  if ((uVar18 >> 0x1a & 1) == 0) {
    fVar26 = local_250;
    if ((uVar18 >> 0x19 & 1) != 0) {
      local_198._4_4_ = (float)local_218._4_4_ + local_1b8;
      local_198._0_4_ = local_78;
      ImDrawList::AddRectFilledMultiColor
                (local_150,&local_148,(ImVec2 *)local_198,(ImU32)local_250,IVar13,IVar13,
                 (ImU32)local_250);
      local_218._4_4_ = local_1b8;
      local_218._0_4_ = local_1b8;
      fStack_210 = local_1b8;
      fStack_20c = local_1b8;
      local_198._0_4_ = local_148.x + local_1b8;
      local_198._4_4_ = local_148.y + local_1b8;
      ImDrawList::AddRectFilledMultiColor
                (pIVar11,&local_148,(ImVec2 *)local_198,0,0,col_bot_right,col_bot_right);
      p_max.x = (float)local_218._0_4_ + local_148.x;
      p_max.y = (float)local_218._4_4_ + local_148.y;
      RenderFrameBorder(local_148,p_max,0.0);
      auVar39._4_4_ = 1.0 - local_258;
      auVar39._0_4_ = local_25c;
      auVar39._8_8_ = 0;
      auVar42 = minps(_DAT_0065b2d0,auVar39);
      fVar26 = local_148.x;
      fVar41 = local_148.y;
      auVar35._0_4_ =
           (float)(int)((float)(-(uint)(0.0 <= local_25c) & auVar42._0_4_) * (float)local_218._0_4_
                        + fVar26 + 0.5);
      auVar35._4_4_ =
           (float)(int)((float)(-(uint)(0.0 <= 1.0 - local_258) & auVar42._4_4_) *
                        (float)local_218._4_4_ + fVar41 + 0.5);
      auVar35._8_4_ = (float)(int)(auVar42._8_4_ * fStack_210 + 0.0 + 0.0);
      auVar35._12_4_ = (float)(int)(auVar42._12_4_ * fStack_20c + 0.0 + 0.0);
      auVar40._0_4_ = (float)local_218._0_4_ + fVar26 + -2.0;
      auVar40._4_4_ = (float)local_218._4_4_ + fVar41 + -2.0;
      auVar40._8_4_ = fStack_210 + 0.0 + 0.0;
      auVar40._12_4_ = fStack_20c + 0.0 + 0.0;
      auVar42 = minps(auVar40,auVar35);
      uVar18 = -(uint)(auVar35._0_4_ < fVar26 + 2.0);
      uVar24 = -(uint)(auVar35._4_4_ < fVar41 + 2.0);
      local_110 = (ImVec2)(CONCAT44(~uVar24 & auVar42._4_4_,~uVar18 & auVar42._0_4_) |
                          CONCAT44((uint)(fVar41 + 2.0) & uVar24,(uint)(fVar26 + 2.0) & uVar18));
      local_218._4_4_ = fStack_1b4;
      local_218._0_4_ = local_1b8 / 6.0;
      fStack_210 = (float)uStack_1b0;
      fStack_20c = (float)uStack_1ac;
      lVar22 = 0;
      do {
        local_198._4_4_ = (float)(int)lVar22 * (float)local_218._0_4_ + local_148.y;
        local_198._0_4_ = local_248._0_4_;
        lVar1 = lVar22 + 1;
        local_118.y = (float)(int)lVar1 * (float)local_218._0_4_ + local_148.y;
        local_118.x = (float)local_238._0_4_;
        fVar26 = (&local_178.y)[lVar22];
        ImDrawList::AddRectFilledMultiColor
                  (pIVar11,(ImVec2 *)local_198,&local_118,(ImU32)fVar38,(ImU32)fVar38,(ImU32)fVar26,
                   (ImU32)fVar26);
        lVar22 = lVar1;
        fVar38 = fVar26;
      } while (lVar1 != 6);
      _local_218 = ZEXT416((uint)(float)(int)(local_260 * local_1b8 + local_148.y + 0.5));
      p_min.y = local_148.y;
      p_min.x = (float)local_248._0_4_;
      p_max_00.y = local_1b8 + local_148.y;
      p_max_00.x = (float)local_238._0_4_;
      RenderFrameBorder(p_min,p_max_00,0.0);
      pos.x = (float)local_248._0_4_ + -1.0;
      pos.y = (float)local_218._0_4_;
      half_sz.x = local_68 + 1.0;
      half_sz.y = local_68;
      RenderArrowsForVerticalBar(pIVar11,pos,half_sz,local_188 + 2.0,(local_220->Style).Alpha);
      fVar26 = local_250;
    }
  }
  else {
    _local_f8 = ZEXT416((uint)(0.5 / (float)local_98._0_4_));
    iVar16 = 4;
    if (4 < (int)(float)local_98._0_4_ / 0xc) {
      iVar16 = (int)(float)local_98._0_4_ / 0xc;
    }
    local_d8._0_4_ = iVar16;
    local_88._4_4_ = 0x80000000;
    local_88._0_4_ = -(0.5 / (float)local_98._0_4_);
    local_88._8_4_ = 0x80000000;
    local_88._12_4_ = 0x80000000;
    local_98._0_4_ = (float)local_98._0_4_ + (float)local_c8._0_4_;
    local_78 = (float)local_98._0_4_ * 0.5;
    local_c8._4_4_ = local_c8._0_4_;
    fStack_c0 = (float)local_c8._0_4_;
    fStack_bc = (float)local_c8._0_4_;
    lVar22 = 0;
    local_100 = IVar13;
    do {
      fVar26 = (float)(int)lVar22 / 6.0;
      fVar26 = (fVar26 + fVar26) * 3.1415927 + (float)local_88._0_4_;
      fVar41 = ((float)(int)lVar22 + 1.0) / 6.0;
      fVar41 = (fVar41 + fVar41) * 3.1415927 + (float)local_f8._0_4_;
      local_218._0_4_ = fVar41;
      iVar16 = (pIVar11->VtxBuffer).Size;
      local_1e8._0_4_ = fVar26;
      ImDrawList::PathArcTo(pIVar11,&local_1d8,local_78,fVar26,fVar41,local_d8._0_4_);
      ImDrawList::AddPolyline
                (pIVar11,(pIVar11->_Path).Data,(pIVar11->_Path).Size,(ImU32)local_250,false,
                 local_24c);
      (pIVar11->_Path).Size = 0;
      iVar25 = (pIVar11->VtxBuffer).Size;
      _local_238 = ZEXT416((uint)local_1d8.x);
      local_248._0_4_ = cosf((float)local_1e8._0_4_);
      local_248._4_4_ = extraout_XMM0_Db_03;
      fStack_240 = (float)extraout_XMM0_Dc_03;
      fStack_23c = (float)extraout_XMM0_Dd_03;
      auVar36._4_4_ = local_1d8.y;
      auVar36._0_4_ = local_238._0_4_;
      auVar36._8_4_ = local_238._4_4_;
      auVar36._12_4_ = 0;
      _local_238 = auVar36;
      fVar26 = sinf((float)local_1e8._0_4_);
      fVar41 = (float)local_248._4_4_ * fStack_c0;
      local_248._4_4_ = fVar26 * (float)local_c8._4_4_ + (float)local_238._4_4_;
      local_248._0_4_ = (float)local_248._0_4_ * (float)local_c8._0_4_ + (float)local_238._0_4_;
      fStack_240 = fVar41 + fStack_230;
      fStack_23c = extraout_XMM0_Db_04 * fStack_bc + fStack_22c;
      _local_238 = ZEXT416((uint)local_1d8.x);
      local_1e8._0_4_ = cosf((float)local_218._0_4_);
      local_1e8._4_4_ = extraout_XMM0_Db_05;
      uStack_1e0._0_4_ = (float)extraout_XMM0_Dc_04;
      uStack_1e0._4_4_ = (float)extraout_XMM0_Dd_04;
      auVar37._4_4_ = local_1d8.y;
      auVar37._0_4_ = local_238._0_4_;
      auVar37._8_4_ = local_238._4_4_;
      auVar37._12_4_ = 0;
      _local_238 = auVar37;
      fVar26 = sinf((float)local_218._0_4_);
      gradient_p1.x = (float)local_1e8._0_4_ * (float)local_c8._0_4_ + (float)local_238._0_4_;
      gradient_p1.y = fVar26 * (float)local_c8._4_4_ + (float)local_238._4_4_;
      fVar26 = (&local_178.y)[lVar22];
      lVar22 = lVar22 + 1;
      ShadeVertsLinearColorGradientKeepAlpha
                (pIVar11,iVar16,iVar25,(ImVec2)local_248,gradient_p1,(ImU32)fVar38,(ImU32)fVar26);
      fVar38 = fVar26;
    } while (lVar22 != 6);
    local_248._0_4_ = cosf((local_260 + local_260) * 3.1415927);
    local_248._4_4_ = extraout_XMM0_Db_06;
    fStack_240 = (float)extraout_XMM0_Dc_05;
    fStack_23c = (float)extraout_XMM0_Dd_05;
    local_238._0_4_ = sinf((local_260 + local_260) * 3.1415927);
    IVar13 = local_100;
    pIVar11 = local_150;
    fVar26 = local_250;
    local_238._4_4_ = extraout_XMM0_Db_07;
    fStack_230 = (float)extraout_XMM0_Dc_06;
    fStack_22c = (float)extraout_XMM0_Dd_06;
    local_198._0_4_ = (float)local_248._0_4_ * (float)local_98._0_4_ * 0.5 + local_1d8.x;
    local_198._4_4_ = (float)local_238._0_4_ * (float)local_98._0_4_ * 0.5 + local_1d8.y;
    if ((char)local_254 == '\0') {
      fVar38 = 0.55;
    }
    else {
      fVar38 = 0.65;
    }
    local_24c = local_24c * fVar38;
    iVar16 = 0x20;
    if ((int)(local_24c / 1.4) < 0x20) {
      iVar16 = (int)(local_24c / 1.4);
    }
    iVar25 = 9;
    if (9 < iVar16) {
      iVar25 = iVar16;
    }
    ImDrawList::AddCircleFilled(local_150,(ImVec2 *)local_198,local_24c,local_100,iVar25);
    col_00 = local_a8._0_4_;
    ImDrawList::AddCircle(pIVar11,(ImVec2 *)local_198,local_24c + 1.0,local_a8._0_4_,iVar25,1.0);
    ImDrawList::AddCircle(pIVar11,(ImVec2 *)local_198,local_24c,(ImU32)fVar26,iVar25,1.0);
    uVar9 = local_238._0_4_;
    uVar10 = local_238._4_4_;
    uVar7 = local_248._0_4_;
    uVar8 = local_248._4_4_;
    fVar38 = (float)local_248._4_4_ * 0.0;
    fVar41 = (float)local_248._4_4_ * 0.0;
    local_218._0_4_ = local_1d8.x;
    local_118.x = local_1c0.x * (float)local_248._0_4_ + -local_1c0.y * (float)local_238._0_4_ +
                  (float)local_218._0_4_;
    local_218._4_4_ = local_1d8.y;
    local_118.y = local_1c0.x * (float)local_238._0_4_ + local_1c0.y * (float)local_248._0_4_ +
                  (float)local_218._4_4_;
    local_248._4_4_ = local_118.y;
    local_248._0_4_ = local_118.x;
    fStack_240 = (float)local_238._4_4_ * 0.0 + (float)local_238._4_4_ * -0.0 + 0.0;
    fStack_23c = fVar41 + fVar38 + 0.0;
    fVar38 = (float)local_238._4_4_ * -0.0;
    fVar43 = (float)local_238._4_4_ * 0.0;
    fVar41 = local_1a0.x * (float)uVar7 + -local_1a0.y * (float)local_238._0_4_ +
             (float)local_218._0_4_;
    local_238._4_4_ =
         local_1a0.x * (float)local_238._0_4_ + local_1a0.y * (float)uVar7 + (float)local_218._4_4_;
    local_238._0_4_ = fVar41;
    fStack_230 = fVar43 + fVar38 + 0.0;
    fStack_22c = (float)uVar8 * 0.0 + (float)uVar8 * 0.0 + 0.0;
    local_38.y = (float)local_238._4_4_;
    local_38.x = fVar41;
    local_218._0_4_ =
         local_1c8.x * (float)uVar7 + -local_1c8.y * (float)uVar9 + (float)local_218._0_4_;
    local_218._4_4_ =
         local_1c8.x * (float)uVar9 + local_1c8.y * (float)uVar7 + (float)local_218._4_4_;
    fStack_210 = (float)uVar10 * 0.0 + (float)uVar10 * -0.0 + 0.0;
    fStack_20c = (float)uVar8 * 0.0 + (float)uVar8 * 0.0 + 0.0;
    local_40.y = (float)local_218._4_4_;
    local_40.x = (float)local_218._0_4_;
    IVar27 = GetFontTexUvWhitePixel();
    uStack_1e0 = extraout_XMM0_Qb;
    local_1e8._0_4_ = IVar27.x;
    local_1e8._4_4_ = IVar27.y;
    ImDrawList::PrimReserve(pIVar11,6,6);
    auVar28 = _local_1e8;
    auVar6 = _local_218;
    auVar29 = _local_238;
    auVar42 = _local_248;
    pIVar3 = pIVar11->_IdxWritePtr;
    *pIVar3 = (ImDrawIdx)pIVar11->_VtxCurrentIdx;
    pIVar11->_IdxWritePtr = pIVar3 + 1;
    pIVar4 = pIVar11->_VtxWritePtr;
    (pIVar4->pos).x = (float)local_248._0_4_;
    (pIVar4->pos).y = (float)local_248._4_4_;
    pIVar4 = pIVar11->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_1e8._0_4_;
    (pIVar4->uv).y = (float)local_1e8._4_4_;
    pIVar4 = pIVar11->_VtxWritePtr;
    pIVar4->col = IVar13;
    pIVar11->_VtxWritePtr = pIVar4 + 1;
    uVar18 = pIVar11->_VtxCurrentIdx + 1;
    pIVar11->_VtxCurrentIdx = uVar18;
    pIVar3 = pIVar11->_IdxWritePtr;
    *pIVar3 = (ImDrawIdx)uVar18;
    pIVar11->_IdxWritePtr = pIVar3 + 1;
    pIVar4[1].pos.x = (float)local_238._0_4_;
    pIVar4[1].pos.y = (float)local_238._4_4_;
    pIVar4 = pIVar11->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_1e8._0_4_;
    (pIVar4->uv).y = (float)local_1e8._4_4_;
    pIVar4 = pIVar11->_VtxWritePtr;
    pIVar4->col = IVar13;
    pIVar11->_VtxWritePtr = pIVar4 + 1;
    uVar18 = pIVar11->_VtxCurrentIdx + 1;
    pIVar11->_VtxCurrentIdx = uVar18;
    pIVar3 = pIVar11->_IdxWritePtr;
    *pIVar3 = (ImDrawIdx)uVar18;
    pIVar11->_IdxWritePtr = pIVar3 + 1;
    pIVar4[1].pos.x = (float)local_218._0_4_;
    pIVar4[1].pos.y = (float)local_218._4_4_;
    pIVar4 = pIVar11->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_1e8._0_4_;
    (pIVar4->uv).y = (float)local_1e8._4_4_;
    pIVar4 = pIVar11->_VtxWritePtr;
    pIVar4->col = (ImU32)fVar26;
    pIVar11->_VtxWritePtr = pIVar4 + 1;
    uVar18 = pIVar11->_VtxCurrentIdx + 1;
    pIVar11->_VtxCurrentIdx = uVar18;
    pIVar3 = pIVar11->_IdxWritePtr;
    *pIVar3 = (ImDrawIdx)uVar18;
    pIVar11->_IdxWritePtr = pIVar3 + 1;
    pIVar4[1].pos.x = (float)local_248._0_4_;
    pIVar4[1].pos.y = (float)local_248._4_4_;
    pIVar4 = pIVar11->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_1e8._0_4_;
    (pIVar4->uv).y = (float)local_1e8._4_4_;
    pIVar4 = pIVar11->_VtxWritePtr;
    pIVar4->col = 0;
    pIVar11->_VtxWritePtr = pIVar4 + 1;
    uVar18 = pIVar11->_VtxCurrentIdx + 1;
    pIVar11->_VtxCurrentIdx = uVar18;
    pIVar3 = pIVar11->_IdxWritePtr;
    *pIVar3 = (ImDrawIdx)uVar18;
    pIVar11->_IdxWritePtr = pIVar3 + 1;
    pIVar4[1].pos.x = (float)local_238._0_4_;
    pIVar4[1].pos.y = (float)local_238._4_4_;
    pIVar4 = pIVar11->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_1e8._0_4_;
    (pIVar4->uv).y = (float)local_1e8._4_4_;
    pIVar4 = pIVar11->_VtxWritePtr;
    pIVar4->col = (ImU32)fVar26;
    pIVar11->_VtxWritePtr = pIVar4 + 1;
    uVar18 = pIVar11->_VtxCurrentIdx + 1;
    pIVar11->_VtxCurrentIdx = uVar18;
    pIVar3 = pIVar11->_IdxWritePtr;
    *pIVar3 = (ImDrawIdx)uVar18;
    pIVar11->_IdxWritePtr = pIVar3 + 1;
    pIVar4[1].pos = local_40;
    pIVar4 = pIVar11->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_1e8._0_4_;
    (pIVar4->uv).y = (float)local_1e8._4_4_;
    pIVar4 = pIVar11->_VtxWritePtr;
    pIVar4->col = 0;
    pIVar11->_VtxWritePtr = pIVar4 + 1;
    pIVar11->_VtxCurrentIdx = pIVar11->_VtxCurrentIdx + 1;
    _local_248 = auVar42;
    _local_238 = auVar29;
    _local_218 = auVar6;
    _local_1e8 = auVar28;
    ImDrawList::AddTriangle(pIVar11,&local_118,&local_38,&local_40,col_00,1.5);
    fVar38 = 1.0;
    if (local_25c <= 1.0) {
      fVar38 = local_25c;
    }
    fVar38 = (float)(~-(uint)(local_25c < 0.0) & (uint)fVar38);
    fVar43 = 1.0 - local_258;
    fVar41 = 1.0;
    if (fVar43 <= 1.0) {
      fVar41 = fVar43;
    }
    fVar41 = (float)(~-(uint)(fVar43 < 0.0) & (uint)fVar41);
    fVar43 = fVar38 * (local_118.x - local_40.x) + local_40.x;
    fVar38 = fVar38 * (local_118.y - local_40.y) + local_40.y;
    local_110.x = fVar41 * (local_38.x - fVar43) + fVar43;
    local_110.y = fVar41 * (local_38.y - fVar38) + fVar38;
  }
  pIVar2 = local_108;
  IVar13 = local_13c;
  pIVar11 = local_150;
  pIVar21 = local_200;
  if (local_138[0] == '\0') {
    fVar38 = 6.0;
  }
  else {
    fVar38 = 10.0;
  }
  local_248._0_4_ = fVar38;
  ImDrawList::AddCircleFilled(local_150,&local_110,fVar38,local_13c,0xc);
  ImDrawList::AddCircle(pIVar11,&local_110,(float)local_248._0_4_ + 1.0,local_a8._0_4_,0xc,1.0);
  ImDrawList::AddCircle(pIVar11,&local_110,(float)local_248._0_4_,(ImU32)fVar26,0xc,1.0);
  pIVar17 = local_220;
  if (local_1cc == 0x10000) {
    fVar38 = pIVar21[1].y;
    _local_238 = ZEXT416((uint)fVar38);
    fVar26 = 1.0;
    if (fVar38 <= 1.0) {
      fVar26 = fVar38;
    }
    _local_248 = ZEXT416((uint)(1.0 - fVar26));
    local_198._4_4_ = local_148.y;
    local_198._0_4_ = local_128._0_4_;
    local_190.x = (float)local_128._0_4_ + local_188;
    local_190.y = local_148.y + local_1b8;
    RenderColorRectWithAlphaCheckerboard
              ((ImVec2)local_198,local_190,0,(local_190.x - (float)local_128._0_4_) * 0.5,
               (ImVec2)0x0,0.0,-1);
    ImDrawList::AddRectFilledMultiColor
              (pIVar11,(ImVec2 *)local_198,&local_190,IVar13,IVar13,IVar13 & 0xffffff,
               IVar13 & 0xffffff);
    local_248._4_4_ = (float)(int)(float)(~local_238._4_4_ & local_248._4_4_);
    local_248._0_4_ =
         (float)(int)((float)(-(uint)((float)local_238._0_4_ < 0.0) & 0x3f800000 |
                             ~-(uint)((float)local_238._0_4_ < 0.0) & local_248._0_4_) * local_1b8 +
                      local_148.y + 0.5);
    fStack_240 = (float)(int)(float)(~(uint)fStack_230 & (uint)fStack_240);
    fStack_23c = (float)(int)(float)(~(uint)fStack_22c & (uint)fStack_23c);
    RenderFrameBorder((ImVec2)local_198,local_190,0.0);
    pos_00.x = (float)local_128._0_4_ + -1.0;
    pos_00.y = (float)local_248._0_4_;
    half_sz_00.x = local_68 + 1.0;
    half_sz_00.y = local_68;
    RenderArrowsForVerticalBar(pIVar11,pos_00,half_sz_00,local_188 + 2.0,(pIVar17->Style).Alpha);
  }
  EndGroup();
  uVar18 = local_fc;
  if ((char)local_fc != '\0') {
    iVar16 = bcmp(local_58,pIVar21,local_b0);
    uVar18 = uVar18 & 0xff;
    if (iVar16 == 0) {
      uVar18 = 0;
    }
  }
  bVar14 = (byte)uVar18;
  if ((uVar18 & 1) != 0) {
    MarkItemEdited((pIVar2->DC).LastItemId);
  }
  PopID();
LAB_002ea31c:
  return (bool)(bVar14 & 1);
}

Assistant:

bool ImGui::ColorPicker4(const char* label, float col[4], ImGuiColorEditFlags flags, const float* ref_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImDrawList* draw_list = window->DrawList;
    ImGuiStyle& style = g.Style;
    ImGuiIO& io = g.IO;

    const float width = CalcItemWidth();
    g.NextItemData.ClearFlags();

    PushID(label);
    BeginGroup();

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
        flags |= ImGuiColorEditFlags_NoSmallPreview;

    // Context menu: display and store options.
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorPickerOptionsPopup(col, flags);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags__PickerMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__PickerMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__PickerMask;
    if (!(flags & ImGuiColorEditFlags__InputMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__InputMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__InputMask;
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)); // Check that only 1 is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask));  // Check that only 1 is selected
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_AlphaBar);

    // Setup
    int components = (flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4;
    bool alpha_bar = (flags & ImGuiColorEditFlags_AlphaBar) && !(flags & ImGuiColorEditFlags_NoAlpha);
    ImVec2 picker_pos = window->DC.CursorPos;
    float square_sz = GetFrameHeight();
    float bars_width = square_sz; // Arbitrary smallish width of Hue/Alpha picking bars
    float sv_picker_size = ImMax(bars_width * 1, width - (alpha_bar ? 2 : 1) * (bars_width + style.ItemInnerSpacing.x)); // Saturation/Value picking box
    float bar0_pos_x = picker_pos.x + sv_picker_size + style.ItemInnerSpacing.x;
    float bar1_pos_x = bar0_pos_x + bars_width + style.ItemInnerSpacing.x;
    float bars_triangles_half_sz = (float)(int)(bars_width * 0.20f);

    float backup_initial_col[4];
    memcpy(backup_initial_col, col, components * sizeof(float));

    float wheel_thickness = sv_picker_size * 0.08f;
    float wheel_r_outer = sv_picker_size * 0.50f;
    float wheel_r_inner = wheel_r_outer - wheel_thickness;
    ImVec2 wheel_center(picker_pos.x + (sv_picker_size + bars_width)*0.5f, picker_pos.y + sv_picker_size*0.5f);

    // Note: the triangle is displayed rotated with triangle_pa pointing to Hue, but most coordinates stays unrotated for logic.
    float triangle_r = wheel_r_inner - (int)(sv_picker_size * 0.027f);
    ImVec2 triangle_pa = ImVec2(triangle_r, 0.0f); // Hue point.
    ImVec2 triangle_pb = ImVec2(triangle_r * -0.5f, triangle_r * -0.866025f); // Black point.
    ImVec2 triangle_pc = ImVec2(triangle_r * -0.5f, triangle_r * +0.866025f); // White point.

    float H = col[0], S = col[1], V = col[2];
    float R = col[0], G = col[1], B = col[2];
    if (flags & ImGuiColorEditFlags_InputRGB)
        ColorConvertRGBtoHSV(R, G, B, H, S, V);
    else if (flags & ImGuiColorEditFlags_InputHSV)
        ColorConvertHSVtoRGB(H, S, V, R, G, B);

    bool value_changed = false, value_changed_h = false, value_changed_sv = false;

    PushItemFlag(ImGuiItemFlags_NoNav, true);
    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Hue wheel + SV triangle logic
        InvisibleButton("hsv", ImVec2(sv_picker_size + style.ItemInnerSpacing.x + bars_width, sv_picker_size));
        if (IsItemActive())
        {
            ImVec2 initial_off = g.IO.MouseClickedPos[0] - wheel_center;
            ImVec2 current_off = g.IO.MousePos - wheel_center;
            float initial_dist2 = ImLengthSqr(initial_off);
            if (initial_dist2 >= (wheel_r_inner-1)*(wheel_r_inner-1) && initial_dist2 <= (wheel_r_outer+1)*(wheel_r_outer+1))
            {
                // Interactive with Hue wheel
                H = ImAtan2(current_off.y, current_off.x) / IM_PI*0.5f;
                if (H < 0.0f)
                    H += 1.0f;
                value_changed = value_changed_h = true;
            }
            float cos_hue_angle = ImCos(-H * 2.0f * IM_PI);
            float sin_hue_angle = ImSin(-H * 2.0f * IM_PI);
            if (ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, ImRotate(initial_off, cos_hue_angle, sin_hue_angle)))
            {
                // Interacting with SV triangle
                ImVec2 current_off_unrotated = ImRotate(current_off, cos_hue_angle, sin_hue_angle);
                if (!ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated))
                    current_off_unrotated = ImTriangleClosestPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated);
                float uu, vv, ww;
                ImTriangleBarycentricCoords(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated, uu, vv, ww);
                V = ImClamp(1.0f - vv, 0.0001f, 1.0f);
                S = ImClamp(uu / V, 0.0001f, 1.0f);
                value_changed = value_changed_sv = true;
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // SV rectangle logic
        InvisibleButton("sv", ImVec2(sv_picker_size, sv_picker_size));
        if (IsItemActive())
        {
            S = ImSaturate((io.MousePos.x - picker_pos.x) / (sv_picker_size-1));
            V = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_sv = true;
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");

        // Hue bar logic
        SetCursorScreenPos(ImVec2(bar0_pos_x, picker_pos.y));
        InvisibleButton("hue", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            H = ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_h = true;
        }
    }

    // Alpha bar logic
    if (alpha_bar)
    {
        SetCursorScreenPos(ImVec2(bar1_pos_x, picker_pos.y));
        InvisibleButton("alpha", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            col[3] = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = true;
        }
    }
    PopItemFlag(); // ImGuiItemFlags_NoNav

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        SameLine(0, style.ItemInnerSpacing.x);
        BeginGroup();
    }

    if (!(flags & ImGuiColorEditFlags_NoLabel))
    {
        const char* label_display_end = FindRenderedTextEnd(label);
        if (label != label_display_end)
        {
            if ((flags & ImGuiColorEditFlags_NoSidePreview))
                SameLine(0, style.ItemInnerSpacing.x);
            TextEx(label, label_display_end);
        }
    }

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        PushItemFlag(ImGuiItemFlags_NoNavDefaultFocus, true);
        ImVec4 col_v4(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if ((flags & ImGuiColorEditFlags_NoLabel))
            Text("Current");

        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf | ImGuiColorEditFlags_NoTooltip;
        ColorButton("##current", col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2));
        if (ref_col != NULL)
        {
            Text("Original");
            ImVec4 ref_col_v4(ref_col[0], ref_col[1], ref_col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : ref_col[3]);
            if (ColorButton("##original", ref_col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2)))
            {
                memcpy(col, ref_col, components * sizeof(float));
                value_changed = true;
            }
        }
        PopItemFlag();
        EndGroup();
    }

    // Convert back color to RGB
    if (value_changed_h || value_changed_sv)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            ColorConvertHSVtoRGB(H >= 1.0f ? H - 10 * 1e-6f : H, S > 0.0f ? S : 10*1e-6f, V > 0.0f ? V : 1e-6f, col[0], col[1], col[2]);
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            col[0] = H;
            col[1] = S;
            col[2] = V;
        }
    }

    // R,G,B and H,S,V slider color editor
    bool value_changed_fix_hue_wrap = false;
    if ((flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        PushItemWidth((alpha_bar ? bar1_pos_x : bar0_pos_x) + bars_width - picker_pos.x);
        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__DataTypeMask | ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoSmallPreview | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf;
        ImGuiColorEditFlags sub_flags = (flags & sub_flags_to_forward) | ImGuiColorEditFlags_NoPicker;
        if (flags & ImGuiColorEditFlags_DisplayRGB || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            if (ColorEdit4("##rgb", col, sub_flags | ImGuiColorEditFlags_DisplayRGB))
            {
                // FIXME: Hackily differenciating using the DragInt (ActiveId != 0 && !ActiveIdAllowOverlap) vs. using the InputText or DropTarget.
                // For the later we don't want to run the hue-wrap canceling code. If you are well versed in HSV picker please provide your input! (See #2050)
                value_changed_fix_hue_wrap = (g.ActiveId != 0 && !g.ActiveIdAllowOverlap);
                value_changed = true;
            }
        if (flags & ImGuiColorEditFlags_DisplayHSV || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            value_changed |= ColorEdit4("##hsv", col, sub_flags | ImGuiColorEditFlags_DisplayHSV);
        if (flags & ImGuiColorEditFlags_DisplayHex || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            value_changed |= ColorEdit4("##hex", col, sub_flags | ImGuiColorEditFlags_DisplayHex);
        PopItemWidth();
    }

    // Try to cancel hue wrap (after ColorEdit4 call), if any
    if (value_changed_fix_hue_wrap && (flags & ImGuiColorEditFlags_InputRGB))
    {
        float new_H, new_S, new_V;
        ColorConvertRGBtoHSV(col[0], col[1], col[2], new_H, new_S, new_V);
        if (new_H <= 0 && H > 0)
        {
            if (new_V <= 0 && V != new_V)
                ColorConvertHSVtoRGB(H, S, new_V <= 0 ? V * 0.5f : new_V, col[0], col[1], col[2]);
            else if (new_S <= 0)
                ColorConvertHSVtoRGB(H, new_S <= 0 ? S * 0.5f : new_S, new_V, col[0], col[1], col[2]);
        }
    }

    if (value_changed)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            R = col[0];
            G = col[1];
            B = col[2];
            ColorConvertRGBtoHSV(R, G, B, H, S, V);
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            H = col[0];
            S = col[1];
            V = col[2];
            ColorConvertHSVtoRGB(H, S, V, R, G, B);
        }
    }

    const int style_alpha8 = IM_F32_TO_INT8_SAT(style.Alpha);
    const ImU32 col_black = IM_COL32(0,0,0,style_alpha8);
    const ImU32 col_white = IM_COL32(255,255,255,style_alpha8);
    const ImU32 col_midgrey = IM_COL32(128,128,128,style_alpha8);
    const ImU32 col_hues[6 + 1] = { IM_COL32(255,0,0,style_alpha8), IM_COL32(255,255,0,style_alpha8), IM_COL32(0,255,0,style_alpha8), IM_COL32(0,255,255,style_alpha8), IM_COL32(0,0,255,style_alpha8), IM_COL32(255,0,255,style_alpha8), IM_COL32(255,0,0,style_alpha8) };

    ImVec4 hue_color_f(1, 1, 1, style.Alpha); ColorConvertHSVtoRGB(H, 1, 1, hue_color_f.x, hue_color_f.y, hue_color_f.z);
    ImU32 hue_color32 = ColorConvertFloat4ToU32(hue_color_f);
    ImU32 user_col32_striped_of_alpha = ColorConvertFloat4ToU32(ImVec4(R, G, B, style.Alpha)); // Important: this is still including the main rendering/style alpha!!

    ImVec2 sv_cursor_pos;

    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Render Hue Wheel
        const float aeps = 0.5f / wheel_r_outer; // Half a pixel arc length in radians (2pi cancels out).
        const int segment_per_arc = ImMax(4, (int)wheel_r_outer / 12);
        for (int n = 0; n < 6; n++)
        {
            const float a0 = (n)     /6.0f * 2.0f * IM_PI - aeps;
            const float a1 = (n+1.0f)/6.0f * 2.0f * IM_PI + aeps;
            const int vert_start_idx = draw_list->VtxBuffer.Size;
            draw_list->PathArcTo(wheel_center, (wheel_r_inner + wheel_r_outer)*0.5f, a0, a1, segment_per_arc);
            draw_list->PathStroke(col_white, false, wheel_thickness);
            const int vert_end_idx = draw_list->VtxBuffer.Size;

            // Paint colors over existing vertices
            ImVec2 gradient_p0(wheel_center.x + ImCos(a0) * wheel_r_inner, wheel_center.y + ImSin(a0) * wheel_r_inner);
            ImVec2 gradient_p1(wheel_center.x + ImCos(a1) * wheel_r_inner, wheel_center.y + ImSin(a1) * wheel_r_inner);
            ShadeVertsLinearColorGradientKeepAlpha(draw_list, vert_start_idx, vert_end_idx, gradient_p0, gradient_p1, col_hues[n], col_hues[n+1]);
        }

        // Render Cursor + preview on Hue Wheel
        float cos_hue_angle = ImCos(H * 2.0f * IM_PI);
        float sin_hue_angle = ImSin(H * 2.0f * IM_PI);
        ImVec2 hue_cursor_pos(wheel_center.x + cos_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f, wheel_center.y + sin_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f);
        float hue_cursor_rad = value_changed_h ? wheel_thickness * 0.65f : wheel_thickness * 0.55f;
        int hue_cursor_segments = ImClamp((int)(hue_cursor_rad / 1.4f), 9, 32);
        draw_list->AddCircleFilled(hue_cursor_pos, hue_cursor_rad, hue_color32, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad+1, col_midgrey, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad, col_white, hue_cursor_segments);

        // Render SV triangle (rotated according to hue)
        ImVec2 tra = wheel_center + ImRotate(triangle_pa, cos_hue_angle, sin_hue_angle);
        ImVec2 trb = wheel_center + ImRotate(triangle_pb, cos_hue_angle, sin_hue_angle);
        ImVec2 trc = wheel_center + ImRotate(triangle_pc, cos_hue_angle, sin_hue_angle);
        ImVec2 uv_white = GetFontTexUvWhitePixel();
        draw_list->PrimReserve(6, 6);
        draw_list->PrimVtx(tra, uv_white, hue_color32);
        draw_list->PrimVtx(trb, uv_white, hue_color32);
        draw_list->PrimVtx(trc, uv_white, col_white);
        draw_list->PrimVtx(tra, uv_white, 0);
        draw_list->PrimVtx(trb, uv_white, col_white);
        draw_list->PrimVtx(trc, uv_white, 0);
        draw_list->AddTriangle(tra, trb, trc, col_midgrey, 1.5f);
        sv_cursor_pos = ImLerp(ImLerp(trc, tra, ImSaturate(S)), trb, ImSaturate(1 - V));
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // Render SV Square
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), col_white, hue_color32, hue_color32, col_white);
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0, 0, col_black, col_black);
        RenderFrameBorder(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0.0f);
        sv_cursor_pos.x = ImClamp((float)(int)(picker_pos.x + ImSaturate(S)     * sv_picker_size + 0.5f), picker_pos.x + 2, picker_pos.x + sv_picker_size - 2); // Sneakily prevent the circle to stick out too much
        sv_cursor_pos.y = ImClamp((float)(int)(picker_pos.y + ImSaturate(1 - V) * sv_picker_size + 0.5f), picker_pos.y + 2, picker_pos.y + sv_picker_size - 2);

        // Render Hue Bar
        for (int i = 0; i < 6; ++i)
            draw_list->AddRectFilledMultiColor(ImVec2(bar0_pos_x, picker_pos.y + i * (sv_picker_size / 6)), ImVec2(bar0_pos_x + bars_width, picker_pos.y + (i + 1) * (sv_picker_size / 6)), col_hues[i], col_hues[i], col_hues[i + 1], col_hues[i + 1]);
        float bar0_line_y = (float)(int)(picker_pos.y + H * sv_picker_size + 0.5f);
        RenderFrameBorder(ImVec2(bar0_pos_x, picker_pos.y), ImVec2(bar0_pos_x + bars_width, picker_pos.y + sv_picker_size), 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar0_pos_x - 1, bar0_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    // Render cursor/preview circle (clamp S/V within 0..1 range because floating points colors may lead HSV values to be out of range)
    float sv_cursor_rad = value_changed_sv ? 10.0f : 6.0f;
    draw_list->AddCircleFilled(sv_cursor_pos, sv_cursor_rad, user_col32_striped_of_alpha, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad+1, col_midgrey, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad, col_white, 12);

    // Render alpha bar
    if (alpha_bar)
    {
        float alpha = ImSaturate(col[3]);
        ImRect bar1_bb(bar1_pos_x, picker_pos.y, bar1_pos_x + bars_width, picker_pos.y + sv_picker_size);
        RenderColorRectWithAlphaCheckerboard(bar1_bb.Min, bar1_bb.Max, 0, bar1_bb.GetWidth() / 2.0f, ImVec2(0.0f, 0.0f));
        draw_list->AddRectFilledMultiColor(bar1_bb.Min, bar1_bb.Max, user_col32_striped_of_alpha, user_col32_striped_of_alpha, user_col32_striped_of_alpha & ~IM_COL32_A_MASK, user_col32_striped_of_alpha & ~IM_COL32_A_MASK);
        float bar1_line_y = (float)(int)(picker_pos.y + (1.0f - alpha) * sv_picker_size + 0.5f);
        RenderFrameBorder(bar1_bb.Min, bar1_bb.Max, 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar1_pos_x - 1, bar1_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    EndGroup();

    if (value_changed && memcmp(backup_initial_col, col, components * sizeof(float)) == 0)
        value_changed = false;
    if (value_changed)
        MarkItemEdited(window->DC.LastItemId);

    PopID();

    return value_changed;
}